

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O3

int json_value_equals(JSON_Value *a,JSON_Value *b)

{
  int iVar1;
  int iVar2;
  JSON_Value *pJVar3;
  JSON_Value *pJVar4;
  size_t sVar5;
  unsigned_long *puVar6;
  JSON_Value_Value *pJVar7;
  JSON_Object *pJVar8;
  JSON_Array *pJVar9;
  ulong uVar10;
  size_t sVar11;
  JSON_Object *object;
  char *name;
  unsigned_long *puVar12;
  bool bVar13;
  bool bVar14;
  double dVar15;
  double dVar16;
  
  iVar1 = -1;
  iVar2 = -1;
  if (a != (JSON_Value *)0x0) {
    iVar2 = a->type;
  }
  if (b != (JSON_Value *)0x0) {
    iVar1 = b->type;
  }
  if (iVar2 != iVar1) goto LAB_0017b2b2;
  bVar13 = true;
  switch(iVar2) {
  case 2:
    if (a == (JSON_Value *)0x0) {
      pJVar7 = (JSON_Value_Value *)0x0;
    }
    else {
      pJVar7 = (JSON_Value_Value *)0x0;
      if (a->type == 2) {
        pJVar7 = &a->value;
      }
    }
    if (b != (JSON_Value *)0x0) {
      bVar13 = false;
      if ((pJVar7 == (JSON_Value_Value *)0x0) || (b->type != 2)) goto switchD_0017b090_default;
      if ((pJVar7->string).length == (b->value).string.length) {
        iVar2 = bcmp((pJVar7->string).chars,(b->value).string.chars,(pJVar7->string).length);
        bVar13 = iVar2 == 0;
        goto switchD_0017b090_default;
      }
    }
    break;
  case 3:
    dVar15 = 0.0;
    dVar16 = 0.0;
    if ((a != (JSON_Value *)0x0) && (a->type == 3)) {
      dVar16 = (a->value).number;
    }
    if ((b != (JSON_Value *)0x0) && (b->type == 3)) {
      dVar15 = (b->value).number;
    }
    bVar13 = ABS(dVar16 - dVar15) < 1e-06;
    goto switchD_0017b090_default;
  case 4:
    if ((a == (JSON_Value *)0x0) || (a->type != 4)) {
      pJVar8 = (JSON_Object *)0x0;
    }
    else {
      pJVar8 = (a->value).object;
    }
    if ((b == (JSON_Value *)0x0) || (b->type != 4)) {
      object = (JSON_Object *)0x0;
    }
    else {
      object = (b->value).object;
    }
    if (pJVar8 == (JSON_Object *)0x0) {
      sVar11 = 0;
    }
    else {
      sVar11 = pJVar8->count;
    }
    if (object == (JSON_Object *)0x0) {
      sVar5 = 0;
    }
    else {
      sVar5 = object->count;
    }
    if (sVar11 == sVar5) {
      if (sVar11 != 0) {
        uVar10 = 0;
        do {
          if ((pJVar8 == (JSON_Object *)0x0) || (pJVar8->count <= uVar10)) {
            name = (char *)0x0;
          }
          else {
            name = pJVar8->names[uVar10];
          }
          pJVar3 = json_object_get_value(pJVar8,name);
          pJVar4 = json_object_get_value(object,name);
          iVar2 = json_value_equals(pJVar3,pJVar4);
          bVar13 = iVar2 != 0;
        } while ((bVar13) && (bVar14 = sVar11 - 1 != uVar10, uVar10 = uVar10 + 1, bVar14));
      }
      goto switchD_0017b090_default;
    }
    break;
  case 5:
    if ((a == (JSON_Value *)0x0) || (a->type != 5)) {
      pJVar9 = (JSON_Array *)0x0;
    }
    else {
      pJVar9 = (a->value).array;
    }
    if ((b == (JSON_Value *)0x0) || (b->type != 5)) {
      pJVar8 = (JSON_Object *)0x0;
    }
    else {
      pJVar8 = (b->value).object;
    }
    if (pJVar9 == (JSON_Array *)0x0) {
      puVar12 = (unsigned_long *)0x0;
    }
    else {
      puVar12 = (unsigned_long *)pJVar9->count;
    }
    if (pJVar8 == (JSON_Object *)0x0) {
      puVar6 = (unsigned_long *)0x0;
    }
    else {
      puVar6 = pJVar8->hashes;
    }
    if (puVar12 == puVar6) {
      if (puVar12 != (unsigned_long *)0x0) {
        puVar6 = (unsigned_long *)0x0;
        do {
          if ((pJVar9 == (JSON_Array *)0x0) || ((unsigned_long *)pJVar9->count <= puVar6)) {
            pJVar3 = (JSON_Value *)0x0;
          }
          else {
            pJVar3 = pJVar9->items[(long)puVar6];
          }
          if ((pJVar8 == (JSON_Object *)0x0) || (pJVar8->hashes <= puVar6)) {
            pJVar4 = (JSON_Value *)0x0;
          }
          else {
            pJVar4 = (JSON_Value *)pJVar8->cells[(long)puVar6];
          }
          iVar2 = json_value_equals(pJVar3,pJVar4);
          bVar13 = iVar2 != 0;
        } while ((bVar13) &&
                (bVar14 = (unsigned_long *)((long)puVar12 + -1) != puVar6,
                puVar6 = (unsigned_long *)((long)puVar6 + 1), bVar14));
      }
      goto switchD_0017b090_default;
    }
    break;
  case 6:
    iVar1 = -1;
    iVar2 = -1;
    if ((a != (JSON_Value *)0x0) && (a->type == 6)) {
      iVar2 = (a->value).boolean;
    }
    if ((b != (JSON_Value *)0x0) && (b->type == 6)) {
      iVar1 = (b->value).boolean;
    }
    bVar13 = iVar2 == iVar1;
  default:
    goto switchD_0017b090_default;
  }
LAB_0017b2b2:
  bVar13 = false;
switchD_0017b090_default:
  return (int)bVar13;
}

Assistant:

int json_value_equals(const JSON_Value *a, const JSON_Value *b) {
    JSON_Object *a_object = NULL, *b_object = NULL;
    JSON_Array *a_array = NULL, *b_array = NULL;
    const JSON_String *a_string = NULL, *b_string = NULL;
    const char *key = NULL;
    size_t a_count = 0, b_count = 0, i = 0;
    JSON_Value_Type a_type, b_type;
    a_type = json_value_get_type(a);
    b_type = json_value_get_type(b);
    if (a_type != b_type) {
        return PARSON_FALSE;
    }
    switch (a_type) {
        case JSONArray:
            a_array = json_value_get_array(a);
            b_array = json_value_get_array(b);
            a_count = json_array_get_count(a_array);
            b_count = json_array_get_count(b_array);
            if (a_count != b_count) {
                return PARSON_FALSE;
            }
            for (i = 0; i < a_count; i++) {
                if (!json_value_equals(json_array_get_value(a_array, i),
                                       json_array_get_value(b_array, i))) {
                    return PARSON_FALSE;
                }
            }
            return PARSON_TRUE;
        case JSONObject:
            a_object = json_value_get_object(a);
            b_object = json_value_get_object(b);
            a_count = json_object_get_count(a_object);
            b_count = json_object_get_count(b_object);
            if (a_count != b_count) {
                return PARSON_FALSE;
            }
            for (i = 0; i < a_count; i++) {
                key = json_object_get_name(a_object, i);
                if (!json_value_equals(json_object_get_value(a_object, key),
                                       json_object_get_value(b_object, key))) {
                    return PARSON_FALSE;
                }
            }
            return PARSON_TRUE;
        case JSONString:
            a_string = json_value_get_string_desc(a);
            b_string = json_value_get_string_desc(b);
            if (a_string == NULL || b_string == NULL) {
                return PARSON_FALSE; /* shouldn't happen */
            }
            return a_string->length == b_string->length &&
                   memcmp(a_string->chars, b_string->chars, a_string->length) == 0;
        case JSONBoolean:
            return json_value_get_boolean(a) == json_value_get_boolean(b);
        case JSONNumber:
            return fabs(json_value_get_number(a) - json_value_get_number(b)) < 0.000001; /* EPSILON */
        case JSONError:
            return PARSON_TRUE;
        case JSONNull:
            return PARSON_TRUE;
        default:
            return PARSON_TRUE;
    }
}